

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

Port * __thiscall Vault::Client::getPort_abi_cxx11_(Port *__return_storage_ptr__,Client *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->port_);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Port getPort() const { return port_; }